

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

TValue * index2adr_stack(lua_State *L,int idx)

{
  TValue *pTVar1;
  
  if (idx < 1) {
    pTVar1 = L->top + idx;
  }
  else {
    pTVar1 = L->base + ((ulong)(uint)idx - 1);
    if (L->top <= pTVar1) {
      return (TValue *)((ulong)(L->glref).ptr32 + 0x130);
    }
  }
  return pTVar1;
}

Assistant:

static TValue *index2adr_stack(lua_State *L, int idx)
{
  if (idx > 0) {
    TValue *o = L->base + (idx - 1);
    if (o < L->top) {
      return o;
    } else {
      lj_checkapi(0, "invalid stack slot %d", idx);
      return niltv(L);
    }
    return o < L->top ? o : niltv(L);
  } else {
    lj_checkapi(idx != 0 && -idx <= L->top - L->base,
		"invalid stack slot %d", idx);
    return L->top + idx;
  }
}